

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O2

void gai_matmul_patch(char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer *alo,
                     Integer *ahi,int avec_pos,Integer g_b,Integer *blo,Integer *bhi,int bvec_pos,
                     Integer g_c,Integer *clo,Integer *chi)

{
  size_t sVar1;
  double dVar2;
  int iVar3;
  byte *pbVar4;
  Integer IVar5;
  Integer IVar6;
  logical lVar7;
  logical lVar8;
  ulong uVar9;
  void *pvVar10;
  undefined8 *buf;
  double *pdVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  double *icode;
  double *pdVar15;
  long lVar16;
  double *pdVar17;
  long lVar18;
  undefined8 *alpha_00;
  long lVar19;
  long lVar20;
  double *pdVar21;
  double *pdVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  bool bVar27;
  bool bVar28;
  double dVar29;
  int cjpos;
  int cipos;
  int bjpos;
  int bipos;
  int ajpos;
  int aipos;
  double *local_3f0;
  double *local_3e8;
  long local_3e0;
  long local_3d8;
  Integer local_3d0;
  byte *local_3c8;
  Integer atype;
  long local_3b8;
  Integer local_3b0;
  void *local_3a8;
  byte *local_3a0;
  long local_398;
  long local_390;
  double *local_388;
  Integer *local_380;
  double *local_378;
  Integer bjhi;
  Integer bjlo;
  Integer bihi;
  Integer ajhi;
  Integer ajlo;
  Integer aihi;
  long local_340;
  Integer local_338;
  void *local_330;
  undefined8 *local_328;
  void *local_320;
  Integer cjhi;
  Integer cjlo;
  Integer bilo;
  Integer ailo;
  Integer bdim2;
  Integer bdim1;
  Integer adim2;
  Integer adim1;
  long local_2d8;
  long cdim_t;
  long bdim_t;
  long adim_t;
  long kdim_t;
  long jdim_t;
  long idim_t;
  undefined8 local_2a0;
  Integer cihi;
  Integer cilo;
  Integer cdim2;
  Integer cdim1;
  double *local_278;
  long local_270;
  Integer local_268;
  Integer crank;
  Integer brank;
  int local_250;
  int cvpos;
  int bvpos;
  int avpos;
  long local_240;
  long local_238;
  long local_230;
  double *local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  Integer arank;
  Integer bdims [7];
  Integer adims [7];
  Integer tmpld [7];
  undefined8 local_128;
  undefined8 uStack_120;
  double *local_110;
  long local_108;
  double *local_100;
  double *local_f8;
  double *local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  double *local_80;
  Integer ctype;
  Integer btype;
  Integer cdims [7];
  
  local_3d0 = g_a;
  local_3c8 = (byte *)transb;
  local_3a0 = (byte *)transa;
  local_380 = alo;
  local_330 = alpha;
  IVar5 = pnga_nodeid();
  iVar3 = _ga_sync_end;
  local_128 = 0x3ff0000000000000;
  uStack_120 = 0;
  local_2a0 = 0x3f800000;
  bVar28 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar28) {
    pnga_sync();
  }
  IVar6 = pnga_total_blocks(local_3d0);
  if (((0 < IVar6) || (IVar6 = pnga_total_blocks(g_b), 0 < IVar6)) ||
     (IVar6 = pnga_total_blocks(g_c), 0 < IVar6)) {
    pnga_matmul_basic((char *)local_3a0,(char *)local_3c8,local_330,beta,local_3d0,local_380,ahi,g_b
                      ,blo,bhi,g_c,clo,chi);
    return;
  }
  local_3e8 = (double *)beta;
  lVar7 = pnga_is_mirrored(local_3d0);
  lVar8 = pnga_is_mirrored(g_b);
  if (lVar7 == lVar8) {
    lVar7 = pnga_is_mirrored(local_3d0);
    lVar8 = pnga_is_mirrored(g_c);
    if (lVar7 != lVar8) goto LAB_00126ac5;
  }
  else {
LAB_00126ac5:
    IVar6 = pnga_nnodes();
    pnga_error("Processors do not match for all arrays",IVar6);
  }
  lVar7 = pnga_is_mirrored(local_3d0);
  if (lVar7 == 0) {
    local_268 = pnga_nnodes();
  }
  else {
    IVar6 = pnga_cluster_nodeid();
    local_268 = pnga_cluster_nprocs(IVar6);
    IVar6 = pnga_cluster_procid(IVar6,0);
    IVar5 = IVar5 - IVar6;
  }
  pnga_inquire(local_3d0,&atype,&arank,adims);
  pnga_inquire(g_b,&btype,&brank,bdims);
  pnga_inquire(g_c,&ctype,&crank,cdims);
  if (arank < 2) {
    pnga_error("rank of A must be at least 2",arank);
  }
  if (brank < 2) {
    pnga_error("rank of B must be at least 2",brank);
  }
  if (crank < 2) {
    pnga_error("rank of C must be at least 2",crank);
  }
  if ((atype != btype) || (atype != ctype)) {
    pnga_error(" types mismatch ",0);
  }
  local_250 = iVar3;
  local_3b0 = IVar5;
  if ((4 < atype - 0x3ebU) || (atype - 0x3ebU == 2)) {
    pnga_error(" type error",atype);
  }
  pbVar4 = local_3a0;
  gai_setup_2d_patch(arank,(char *)local_3a0,adims,local_380,ahi,&ailo,&aihi,&ajlo,&ajhi,&adim1,
                     &adim2,&aipos,&ajpos,&avpos,avec_pos);
  gai_setup_2d_patch(brank,(char *)local_3c8,bdims,blo,bhi,&bilo,&bihi,&bjlo,&bjhi,&bdim1,&bdim2,
                     &bipos,&bjpos,&bvpos,bvec_pos);
  gai_setup_2d_patch(crank,(char *)0x0,cdims,clo,chi,&cilo,&cihi,&cjlo,&cjhi,&cdim1,&cdim2,&cipos,
                     &cjpos,&cvpos,-1);
  if ((*pbVar4 | 0x20) == 0x6e) {
    if (((ailo < 1) || (adim1 < aihi)) || (lVar23 = adim2, ajlo < 1)) goto LAB_00126e96;
joined_r0x00126e8a:
    local_3e0 = ailo;
    if (lVar23 < ajhi) goto LAB_00126e96;
  }
  else {
    if (((0 < ailo) && (aihi <= adim2)) && (lVar23 = adim1, 0 < ajlo)) goto joined_r0x00126e8a;
LAB_00126e96:
    local_3e0 = ailo;
    pnga_error("  g_a indices out of range ",local_3d0);
  }
  if ((*local_3c8 | 0x20) == 0x6e) {
    if (((bilo < 1) || (bdim1 < bihi)) || (lVar23 = bdim2, bjlo < 1)) goto LAB_00126f3b;
joined_r0x00126f39:
    local_3b8 = bilo;
    if (lVar23 < bjhi) goto LAB_00126f3b;
  }
  else {
    if (((0 < bilo) && (bihi <= bdim2)) && (lVar23 = bdim1, 0 < bjlo)) goto joined_r0x00126f39;
LAB_00126f3b:
    local_3b8 = bilo;
    pnga_error("  g_b indices out of range ",g_b);
  }
  lVar23 = cihi;
  IVar5 = cjlo;
  lVar24 = cjhi;
  local_398 = cilo;
  if (((cilo < 1) || (cdim1 < cihi)) || ((cjlo < 1 || (cdim2 < cjhi)))) {
    pnga_error("  g_c indices out of range ",g_c);
  }
  lVar25 = bihi;
  lVar16 = aihi - local_3e0;
  pdVar14 = (double *)(lVar16 + 1);
  local_390 = ajlo;
  lVar19 = ajhi - ajlo;
  local_3f0 = (double *)(lVar19 + 1);
  lVar20 = bihi - local_3b8;
  lVar13 = bjhi;
  local_340 = bjlo;
  lVar12 = bjhi - bjlo;
  icode = (double *)(lVar12 + 1);
  lVar18 = lVar23 - local_398;
  local_338 = IVar5;
  lVar26 = lVar24 - IVar5;
  if (((lVar16 != lVar18) || (lVar19 != lVar20)) || (lVar12 != lVar26)) {
    local_270 = bjhi;
    local_2d8 = ajhi;
    local_3d8 = bihi;
    if (-1 < cvpos || (-1 < bvpos || avpos < 0)) {
      local_378 = (double *)aihi;
      local_388 = pdVar14;
      if (cvpos < 0 && (-1 < bvpos && avpos < 0)) {
        lVar12 = (long)bipos;
        bipos = bipos + -1;
        lVar16 = (long)bjpos;
        bjpos = bjpos + -1;
        local_3b8 = blo[lVar12 + -1];
        lVar25 = bhi[lVar12 + -1];
        bjlo = blo[lVar16 + -1];
        bjhi = bhi[lVar16 + -1];
        bdim1 = bdims[lVar12 + -1];
        bdim2 = bdims[lVar16 + -1];
        icode = (double *)((bjhi - bjlo) + 1);
        local_3d8 = bihi;
        bihi = lVar25;
        local_340 = bjlo;
        bilo = local_3b8;
        local_2d8 = ajhi;
        local_270 = lVar13;
      }
      else if (cvpos < 0 || -1 < (avpos & bvpos)) {
        bVar28 = -1 < (avpos | bvpos);
        if (cvpos < 0 && bVar28) {
          if (lVar16 != lVar18) {
            lVar13 = (long)aipos;
            aipos = aipos + -1;
            lVar16 = (long)ajpos;
            ajpos = ajpos + -1;
            local_3e0 = local_380[lVar13 + -1];
            aihi = ahi[lVar13 + -1];
            ajlo = local_380[lVar16 + -1];
            ajhi = ahi[lVar16 + -1];
            adim1 = adims[lVar13 + -1];
            adim2 = adims[lVar16 + -1];
            pdVar14 = (double *)((aihi - local_3e0) + 1);
            local_3f0 = (double *)((ajhi - ajlo) + 1);
            ailo = local_3e0;
          }
          local_390 = ajlo;
          local_378 = (double *)aihi;
          if (lVar12 != lVar26) {
            lVar13 = (long)bipos;
            bipos = bipos + -1;
            lVar12 = (long)bjpos;
            bjpos = bjpos + -1;
            local_3b8 = blo[lVar13 + -1];
            lVar25 = bhi[lVar13 + -1];
            bjlo = blo[lVar12 + -1];
            bjhi = bhi[lVar12 + -1];
            bdim1 = bdims[lVar13 + -1];
            bdim2 = bdims[lVar12 + -1];
            pdVar14 = (double *)((aihi - local_3e0) + 1);
            local_3f0 = (double *)((ajhi - ajlo) + 1);
            icode = (double *)((bjhi - bjlo) + 1);
            bihi = lVar25;
            local_340 = bjlo;
            bilo = local_3b8;
          }
        }
        else if ((-1 < bvpos || avpos < 0) || cvpos < 0) {
          if ((-1 < bvpos && avpos < 0) && -1 < cvpos) {
            if (lVar19 != lVar20) {
              lVar13 = (long)bipos;
              bipos = bipos + -1;
              lVar25 = (long)bjpos;
              bjpos = bjpos + -1;
              local_3b8 = blo[lVar13 + -1];
              bihi = bhi[lVar13 + -1];
              bjlo = blo[lVar25 + -1];
              bjhi = bhi[lVar25 + -1];
              bdim1 = bdims[lVar13 + -1];
              bdim2 = bdims[lVar25 + -1];
              icode = (double *)((bjhi - bjlo) + 1);
              bilo = local_3b8;
            }
            lVar25 = bihi;
            local_340 = bjlo;
            if (lVar16 != lVar18) {
              lVar13 = (long)cipos;
              cipos = cipos + -1;
              lVar12 = (long)cjpos;
              cjpos = cjpos + -1;
              local_398 = clo[lVar13 + -1];
              lVar23 = chi[lVar13 + -1];
              local_338 = clo[lVar12 + -1];
              lVar24 = chi[lVar12 + -1];
              cdim1 = cdims[lVar13 + -1];
              cdim2 = cdims[lVar12 + -1];
              icode = (double *)((bjhi - bjlo) + 1);
              cjhi = lVar24;
              cjlo = local_338;
              cihi = lVar23;
              cilo = local_398;
            }
          }
          else if (bVar28 && -1 < cvpos) {
            pnga_error("a and b and c ambiguous",1);
          }
        }
        else {
          if (lVar19 != lVar20) {
            lVar13 = (long)aipos;
            aipos = aipos + -1;
            lVar16 = (long)ajpos;
            ajpos = ajpos + -1;
            local_3e0 = local_380[lVar13 + -1];
            aihi = ahi[lVar13 + -1];
            ajlo = local_380[lVar16 + -1];
            ajhi = ahi[lVar16 + -1];
            adim1 = adims[lVar13 + -1];
            adim2 = adims[lVar16 + -1];
            pdVar14 = (double *)((aihi - local_3e0) + 1);
            local_3f0 = (double *)((ajhi - ajlo) + 1);
            ailo = local_3e0;
          }
          local_390 = ajlo;
          local_378 = (double *)aihi;
          if (lVar12 != lVar26) {
            lVar13 = (long)cipos;
            cipos = cipos + -1;
            lVar12 = (long)cjpos;
            cjpos = cjpos + -1;
            local_398 = clo[lVar13 + -1];
            lVar23 = chi[lVar13 + -1];
            local_338 = clo[lVar12 + -1];
            lVar24 = chi[lVar12 + -1];
            cdim1 = cdims[lVar13 + -1];
            cdim2 = cdims[lVar12 + -1];
            local_3f0 = (double *)((ajhi - ajlo) + 1);
            pdVar14 = (double *)((aihi - local_3e0) + 1);
            local_378 = (double *)aihi;
            cjhi = lVar24;
            cjlo = local_338;
            cihi = lVar23;
            cilo = local_398;
          }
        }
      }
      else {
        lVar13 = (long)cipos;
        cipos = cipos + -1;
        lVar12 = (long)cjpos;
        cjpos = cjpos + -1;
        local_398 = clo[lVar13 + -1];
        lVar23 = chi[lVar13 + -1];
        local_338 = clo[lVar12 + -1];
        lVar24 = chi[lVar12 + -1];
        cdim1 = cdims[lVar13 + -1];
        cdim2 = cdims[lVar12 + -1];
        cjhi = lVar24;
        cjlo = local_338;
        cihi = lVar23;
        cilo = local_398;
      }
    }
    else {
      lVar13 = (long)aipos;
      aipos = aipos + -1;
      lVar12 = (long)ajpos;
      ajpos = ajpos + -1;
      local_3e0 = local_380[lVar13 + -1];
      aihi = ahi[lVar13 + -1];
      local_390 = local_380[lVar12 + -1];
      ajhi = ahi[lVar12 + -1];
      adim1 = adims[lVar13 + -1];
      adim2 = adims[lVar12 + -1];
      local_3f0 = (double *)((ajhi - local_390) + 1);
      pdVar14 = (double *)((aihi - local_3e0) + 1);
      ajlo = local_390;
      ailo = local_3e0;
    }
  }
  if ((double *)((lVar23 - local_398) + 1) != pdVar14) {
    pnga_error(" a & c dims error",(Integer)pdVar14);
  }
  if ((double *)((lVar24 - local_338) + 1) != icode) {
    pnga_error(" b & c dims error",(Integer)icode);
  }
  pdVar22 = local_3f0;
  if ((double *)((lVar25 - local_3b8) + 1) != local_3f0) {
    pnga_error(" a & b dims error",(Integer)local_3f0);
  }
  dVar29 = pow(((double)((long)pdVar14 * (long)icode) * (double)(long)pdVar22) /
               (double)(local_268 * 10),0.3333333333333333);
  pdVar11 = (double *)(long)dVar29;
  pdVar22 = (double *)0x20;
  if (0x20 < (long)pdVar11) {
    pdVar22 = pdVar11;
  }
  uVar9 = 0x10 / (&QWORD_001cf5a8)[atype * 2];
  local_388 = pdVar14;
  if ((long)pdVar11 < 0x101) {
    lVar23 = uVar9 * 4 + 0x30000;
    pdVar11 = (double *)0x100;
    pdVar14 = (double *)0x100;
    pdVar22 = (double *)0x100;
  }
  else {
    tmpld[0] = pnga_memory_avail_type(atype);
    IVar5 = pnga_type_f2c(0x3f2);
    pnga_gop(IVar5,tmpld,1,"min");
    if ((tmpld[0] < 0x40) && (IVar5 = pnga_nodeid(), IVar5 == 0)) {
      pnga_error("Not enough memory",tmpld[0]);
    }
    lVar23 = (long)((double)tmpld[0] * 0.9);
    dVar29 = (double)((lVar23 + -4) / 3);
    if (dVar29 < 0.0) {
      dVar2 = sqrt(dVar29);
    }
    else {
      dVar2 = SQRT(dVar29);
    }
    if ((long)dVar2 < (long)pdVar22) {
      if (dVar29 < 0.0) {
        dVar29 = sqrt(dVar29);
      }
      else {
        dVar29 = SQRT(dVar29);
      }
      pdVar22 = (double *)(long)dVar29;
    }
    pdVar11 = pdVar22;
    if ((long)pdVar14 < (long)pdVar22) {
      pdVar11 = pdVar14;
    }
    pdVar14 = pdVar22;
    if ((long)icode < (long)pdVar22) {
      pdVar14 = icode;
    }
    if ((long)local_3f0 < (long)pdVar22) {
      pdVar22 = local_3f0;
    }
  }
  pvVar10 = pnga_malloc(lVar23,(int)atype,"GA mulmat bufs");
  IVar5 = local_3b0;
  lVar23 = (((long)pdVar22 * (long)pdVar11) / (long)uVar9) * 0x10;
  lVar24 = (((long)pdVar14 * (long)pdVar22) / (long)uVar9) * 0x10;
  local_3a8 = pvVar10;
  local_278 = pdVar14;
  local_228 = pdVar11;
  local_100 = pdVar22;
  if (atype == 0x3ec) {
    bVar28 = NAN(*local_3e8);
    bVar27 = *local_3e8 == 0.0;
LAB_001275e9:
    if ((bVar27) && (!bVar28)) {
      pnga_fill_patch(g_c,clo,chi,local_3e8);
      goto LAB_00127629;
    }
  }
  else {
    if (atype != 0x3ee) {
      if (atype == 0x3ef) {
        if ((*local_3e8 != 0.0) || (NAN(*local_3e8))) goto LAB_0012760c;
        bVar28 = NAN(local_3e8[1]);
        bVar27 = local_3e8[1] == 0.0;
      }
      else {
        bVar28 = NAN(*(float *)local_3e8);
        bVar27 = *(float *)local_3e8 == 0.0;
      }
      goto LAB_001275e9;
    }
    if ((*(float *)local_3e8 == 0.0) && (!NAN(*(float *)local_3e8))) {
      bVar28 = NAN(*(float *)((long)local_3e8 + 4));
      bVar27 = *(float *)((long)local_3e8 + 4) == 0.0;
      goto LAB_001275e9;
    }
  }
LAB_0012760c:
  pnga_scale_patch(g_c,clo,chi,local_3e8);
LAB_00127629:
  local_320 = (void *)((long)local_3a8 + lVar23 + 0x10);
  buf = (undefined8 *)((long)pvVar10 + lVar24 + 0x20 + lVar23);
  local_b0 = (long)aipos;
  local_b8 = (long)ajpos;
  local_e0 = (long)bipos;
  local_e8 = (long)bjpos;
  local_c0 = (long)cipos;
  local_c8 = (long)cjpos;
  lVar23 = (long)local_3a8 + lVar23 + lVar24 + 0x20;
  lVar13 = 0;
  lVar24 = 0;
  pdVar14 = local_3f0;
  pdVar22 = (double *)0x0;
  pdVar11 = local_278;
  pdVar15 = local_388;
  pdVar17 = local_228;
  local_328 = buf;
  local_d0 = lVar23;
  while( true ) {
    pdVar21 = pdVar11;
    if ((long)icode < (long)pdVar11) {
      pdVar21 = icode;
    }
    if ((long)icode <= (long)pdVar22) break;
    lVar25 = (long)pdVar21 + lVar13;
    local_110 = (double *)((long)local_278 + (long)pdVar22);
    pdVar21 = local_110;
    if ((long)icode < (long)local_110) {
      pdVar21 = icode;
    }
    local_210 = (long)pdVar21 - (long)pdVar22;
    local_238 = local_340 + (long)pdVar22;
    local_240 = (long)pdVar21 + local_340 + -1;
    local_90 = (long)pdVar22 + local_338;
    local_a0 = (long)pdVar21 + local_338 + -1;
    local_a8 = (local_a0 - local_90) + 1;
    pdVar22 = (double *)0x0;
    local_108 = lVar13;
    local_f8 = pdVar11;
    local_98 = lVar25;
    while ((long)pdVar22 < (long)pdVar14) {
      local_f0 = (double *)((long)local_100 + (long)pdVar22);
      pdVar11 = local_f0;
      if ((long)pdVar14 < (long)local_f0) {
        pdVar11 = pdVar14;
      }
      local_3d8 = (long)pdVar11 - (long)pdVar22;
      local_218 = local_390 + (long)pdVar22;
      local_220 = (long)pdVar11 + local_390 + -1;
      local_d8 = (long)pdVar22 + local_3b8;
      local_230 = (long)pdVar11 + local_3b8 + -1;
      lVar13 = 0;
      bVar28 = true;
      pdVar11 = (double *)0x0;
      pdVar21 = pdVar17;
      while( true ) {
        IVar6 = arank;
        pdVar14 = pdVar21;
        if ((long)pdVar15 < (long)pdVar21) {
          pdVar14 = pdVar15;
        }
        lVar12 = ((long)pdVar14 + lVar13) * lVar25;
        if (lVar12 < 1) {
          lVar12 = 0;
        }
        pdVar22 = local_f0;
        pdVar14 = local_3f0;
        if ((long)pdVar15 <= (long)pdVar11) break;
        pdVar14 = (double *)((long)pdVar11 + (long)pdVar17);
        local_3e8 = pdVar11;
        if (lVar24 % local_268 == IVar5) {
          pdVar22 = pdVar14;
          if ((long)pdVar15 < (long)pdVar14) {
            pdVar22 = pdVar15;
          }
          if (atype == 0x3eb) {
            for (lVar25 = 0; lVar12 != lVar25; lVar25 = lVar25 + 1) {
              *(undefined4 *)(lVar23 + lVar25 * 4) = 0;
            }
          }
          else if (atype == 0x3ec) {
            for (lVar25 = 0; lVar12 != lVar25; lVar25 = lVar25 + 1) {
              *(undefined8 *)(lVar23 + lVar25 * 8) = 0;
            }
          }
          else if (atype == 0x3ee) {
            for (lVar25 = 0; lVar12 != lVar25; lVar25 = lVar25 + 1) {
              *(undefined8 *)(lVar23 + lVar25 * 8) = 0;
            }
          }
          else {
            while (bVar27 = lVar12 != 0, lVar12 = lVar12 + -1, bVar27) {
              *buf = 0;
              buf[1] = 0;
              buf = buf + 2;
            }
          }
          local_88 = (long)pdVar22 + -1;
          lVar23 = (local_88 - (long)pdVar11) + 1;
          if ((*local_3a0 | 0x20) == 0x6e) {
            local_200 = local_218;
            lVar12 = local_3e0 + (long)pdVar11;
            lVar25 = local_220;
            lVar16 = local_3e0 + local_88;
            local_1f8 = lVar23;
          }
          else {
            local_200 = local_3e0 + (long)pdVar11;
            lVar25 = local_3e0 + local_88;
            local_1f8 = local_3d8;
            lVar12 = local_218;
            lVar16 = local_220;
          }
          sVar1 = arank * 8;
          local_378 = pdVar21;
          local_2d8 = lVar24;
          local_270 = lVar13;
          local_80 = pdVar14;
          memcpy(adims,local_380,sVar1);
          memcpy(bdims,ahi,sVar1);
          if (IVar6 < 2) {
            IVar6 = 1;
          }
          for (lVar24 = 0; lVar13 = local_b0, IVar6 + -1 != lVar24; lVar24 = lVar24 + 1) {
            tmpld[lVar24] = 1;
          }
          adims[local_b0] = lVar12;
          bdims[lVar13] = lVar16;
          lVar24 = local_b8;
          adims[local_b8] = local_200;
          bdims[lVar24] = lVar25;
          tmpld[lVar13] = (lVar16 - lVar12) + 1;
          tmpld[lVar24] = (lVar25 - local_200) + 1;
          pnga_get(local_3d0,adims,bdims,local_3a8,tmpld);
          IVar5 = brank;
          if (bVar28) {
            local_208 = local_3d8;
            lVar24 = local_238;
            lVar13 = local_d8;
            lVar25 = local_240;
            lVar12 = local_230;
            if ((*local_3c8 | 0x20) != 0x6e) {
              local_208 = local_210;
              lVar24 = local_d8;
              lVar13 = local_238;
              lVar25 = local_230;
              lVar12 = local_240;
            }
            sVar1 = brank * 8;
            memcpy(adims,blo,sVar1);
            memcpy(bdims,bhi,sVar1);
            if (IVar5 < 2) {
              IVar5 = 1;
            }
            for (lVar16 = 0; lVar18 = local_e0, IVar5 + -1 != lVar16; lVar16 = lVar16 + 1) {
              tmpld[lVar16] = 1;
            }
            adims[local_e0] = lVar13;
            bdims[lVar18] = lVar12;
            lVar16 = local_e8;
            adims[local_e8] = lVar24;
            bdims[lVar16] = lVar25;
            tmpld[lVar18] = (lVar12 - lVar13) + 1;
            tmpld[lVar16] = (lVar25 - lVar24) + 1;
            pnga_get(g_b,adims,bdims,local_320,tmpld);
          }
          buf = local_328;
          jdim_t = local_210;
          kdim_t = local_3d8;
          adim_t = local_1f8;
          bdim_t = local_208;
          cdim_t = lVar23;
          idim_t = lVar23;
          switch(atype) {
          case 0x3eb:
            gal_sgemm_(local_3a0,local_3c8,&idim_t,&jdim_t,&kdim_t,local_330,local_3a8,&adim_t,
                       local_320,&bdim_t,&local_2a0,local_328,&cdim_t,1,1);
            break;
          case 0x3ec:
            gal_dgemm_(local_3a0,local_3c8,&idim_t,&jdim_t,&kdim_t,local_330,local_3a8,&adim_t,
                       local_320,&bdim_t,&local_128,local_328,&cdim_t,1,1);
            break;
          default:
            pnga_error("ga_matmul_patch: wrong data type",atype);
            buf = local_328;
            break;
          case 0x3ee:
            gal_cgemm_(local_3a0,local_3c8,&idim_t,&jdim_t,&kdim_t,local_330,local_3a8,&adim_t,
                       local_320,&bdim_t,&local_2a0,local_328,&cdim_t,1,1);
            break;
          case 0x3ef:
            gal_zgemm_(local_3a0,local_3c8,&idim_t,&jdim_t,&kdim_t,local_330,local_3a8,&adim_t,
                       local_320,&bdim_t,&local_128,local_328,&cdim_t,1,1);
          }
          IVar6 = crank;
          IVar5 = local_3b0;
          local_3e8 = (double *)((long)local_3e8 + local_398);
          sVar1 = crank * 8;
          memcpy(adims,clo,sVar1);
          memcpy(bdims,chi,sVar1);
          lVar23 = local_88;
          lVar25 = local_98;
          if (IVar6 < 2) {
            IVar6 = 1;
          }
          for (lVar24 = 0; lVar13 = local_c0, IVar6 + -1 != lVar24; lVar24 = lVar24 + 1) {
            tmpld[lVar24] = 1;
          }
          adims[local_c0] = (Integer)local_3e8;
          bdims[lVar13] = lVar23 + local_398;
          lVar24 = local_c8;
          adims[local_c8] = local_90;
          bdims[lVar24] = local_a0;
          tmpld[lVar13] = ((lVar23 + local_398) - (long)local_3e8) + 1;
          tmpld[lVar24] = local_a8;
          alpha_00 = &local_2a0;
          if ((atype != 0x3eb) && (atype != 0x3ee)) {
            alpha_00 = &local_128;
          }
          pnga_acc(g_c,adims,bdims,buf,tmpld,alpha_00);
          bVar28 = false;
          lVar13 = local_270;
          pdVar14 = local_80;
          pdVar15 = local_388;
          pdVar17 = local_228;
          lVar23 = local_d0;
          lVar24 = local_2d8;
          pdVar21 = local_378;
        }
        lVar24 = lVar24 + 1;
        pdVar21 = (double *)((long)pdVar21 + (long)pdVar17);
        lVar13 = lVar13 - (long)pdVar17;
        pdVar11 = pdVar14;
      }
    }
    pdVar11 = (double *)((long)local_f8 + (long)local_278);
    lVar13 = local_108 - (long)local_278;
    pdVar22 = local_110;
  }
  pnga_free(local_3a8);
  if (local_250 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void gai_matmul_patch(char *transa, char *transb, void *alpha, void *beta, 
    Integer g_a, Integer alo[], Integer ahi[], int avec_pos,
    Integer g_b, Integer blo[], Integer bhi[], int bvec_pos,
    Integer g_c, Integer clo[], Integer chi[])
{
#ifdef STATBUF
   DoubleComplex a[ICHUNK*KCHUNK], b[KCHUNK*JCHUNK], c[ICHUNK*JCHUNK];
#else
   DoubleComplex *a, *b, *c;
#endif
Integer atype, btype, ctype, adim1, adim2, bdim1, bdim2, cdim1, cdim2;
Integer me= pnga_nodeid(), nproc, inode, iproc;
Integer i, ijk = 0, i0, i1, j0, j1;
Integer ilo, ihi, idim, jlo, jhi, jdim, klo, khi, kdim;
Integer n, m, k, k2, cm, cn, adim, bdim, cdim, arank, brank, crank;
int aipos, ajpos, bipos, bjpos,cipos, cjpos, need_scaling=1;
int avpos, bvpos, cvpos;
Integer Ichunk, Kchunk, Jchunk;
Integer ailo, aihi, ajlo, ajhi;    /* 2d plane of g_a */
Integer bilo, bihi, bjlo, bjhi;    /* 2d plane of g_b */
Integer cilo, cihi, cjlo, cjhi;    /* 2d plane of g_c */
Integer adims[GA_MAX_DIM],bdims[GA_MAX_DIM],cdims[GA_MAX_DIM],tmpld[GA_MAX_DIM];
Integer *tmplo = adims, *tmphi =bdims; 
DoubleComplex ONE;
SingleComplex ONE_CF;
Integer ZERO_I = 0;
Integer get_new_B;
DoublePrecision chunk_cube;
Integer min_tasks = 10, max_chunk;
int local_sync_begin,local_sync_end;
BlasInt idim_t, jdim_t, kdim_t, adim_t, bdim_t, cdim_t;

   ONE.real =1.; ONE.imag =0.;
   ONE_CF.real =1.; ONE_CF.imag =0.;
   
   local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   if(local_sync_begin)pnga_sync();

   if (pnga_total_blocks(g_a) > 0 || pnga_total_blocks(g_b) > 0 ||
       pnga_total_blocks(g_c) > 0) {
     pnga_matmul_basic(transa, transb, alpha, beta, g_a, alo, ahi,
         g_b, blo, bhi, g_c, clo, chi);
     return;
   }

   /* Check to make sure all global arrays are of the same type */
   if (!(pnga_is_mirrored(g_a) == pnga_is_mirrored(g_b) &&
        pnga_is_mirrored(g_a) == pnga_is_mirrored(g_c))) {
     pnga_error("Processors do not match for all arrays",pnga_nnodes());
   }
   if (pnga_is_mirrored(g_a)) {
     inode = pnga_cluster_nodeid();
     nproc = pnga_cluster_nprocs(inode);
     iproc = me - pnga_cluster_procid(inode, ZERO_I);
   } else {
     nproc = pnga_nnodes();
     iproc = me;
   }

   pnga_inquire(g_a, &atype, &arank, adims);
   pnga_inquire(g_b, &btype, &brank, bdims);
   pnga_inquire(g_c, &ctype, &crank, cdims);

   if(arank<2)  pnga_error("rank of A must be at least 2",arank);
   if(brank<2)  pnga_error("rank of B must be at least 2",brank);
   if(crank<2)  pnga_error("rank of C must be at least 2",crank);

   if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L);
   if(atype != C_DCPL && atype != C_DBL && atype != C_FLOAT && atype != C_SCPL)
     pnga_error(" type error",atype);
   
   gai_setup_2d_patch(arank, transa, adims, alo, ahi, &ailo, &aihi,
                      &ajlo, &ajhi, &adim1, &adim2, &aipos, &ajpos, &avpos, avec_pos);
   gai_setup_2d_patch(brank, transb, bdims, blo, bhi, &bilo, &bihi,
                      &bjlo, &bjhi, &bdim1, &bdim2, &bipos, &bjpos, &bvpos, bvec_pos);
   gai_setup_2d_patch(crank, NULL, cdims, clo, chi, &cilo, &cihi,
                      &cjlo, &cjhi, &cdim1, &cdim2, &cipos, &cjpos, &cvpos, -1);


   /* check if patch indices and dims match */
   if (*transa == 'n' || *transa == 'N'){
      if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
         pnga_error("  g_a indices out of range ", g_a);
   }else
      if (ailo <= 0 || aihi > adim2 || ajlo <= 0 || ajhi > adim1)
         pnga_error("  g_a indices out of range ", g_a);

   if (*transb == 'n' || *transb == 'N'){
      if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
          pnga_error("  g_b indices out of range ", g_b);
   }else
      if (bilo <= 0 || bihi > bdim2 || bjlo <= 0 || bjhi > bdim1)
          pnga_error("  g_b indices out of range ", g_b);


   if (cilo <= 0 || cihi > cdim1 || cjlo <= 0 || cjhi > cdim2)
       pnga_error("  g_c indices out of range ", g_c);

   /* verify if patch dimensions are consistent */
#define RESET() do {   \
   m = aihi - ailo +1; \
   k = ajhi - ajlo +1; \
   k2= bihi - bilo +1; \
   n = bjhi - bjlo +1; \
   cm= cihi - cilo +1; \
   cn= cjhi - cjlo +1; \
} while (0)
   RESET();
#define SHIFT(L,INC) do {      \
   L##ipos+=INC;               \
   L##jpos+=INC;               \
   L##ilo = L##lo[L##ipos];    \
   L##ihi = L##hi[L##ipos];    \
   L##jlo = L##lo[L##jpos];    \
   L##jhi = L##hi[L##jpos];    \
   L##dim1 = L##dims[L##ipos]; \
   L##dim2 = L##dims[L##jpos]; \
   RESET();                    \
} while (0)
   /* gai_setup_2d_patch may produce ambiguous vectors */
   if (!(m==cm && k==k2 && n==cn)) {
       /* patches don't agree */
       if (avpos>=0 && bvpos<0 && cvpos<0) {
           /* only A is an ambiguous vector */
           SHIFT(a,-1);
       }
       else if (avpos<0 && bvpos>=0 && cvpos<0) {
           /* only B is an ambiguous vector */
           SHIFT(b,-1);
       }
       else if (avpos<0 && bvpos<0 && cvpos>=0) {
           /* only C is an ambiguous vector */
           SHIFT(c,-1);
       }
       else if (avpos>=0 && bvpos>=0 && cvpos<0) {
           /* A and B are ambiguous vectors */
           if (m != cm) {
               SHIFT(a,-1);
           }
           if (n != cn) {
               SHIFT(b,-1);
           }
       }
       else if (avpos>=0 && bvpos<0 && cvpos>=0) {
           /* A and C are ambiguous vectors */
           if (k != k2) {
               SHIFT(a,-1);
           }
           if (n != cn) {
               SHIFT(c,-1);
           }
       }
       else if (avpos<0 && bvpos>=0 && cvpos>=0) {
           /* B and C are ambiguous vectors */
           if (k != k2) {
               SHIFT(b,-1);
           }
           if (m != cm) {
               SHIFT(c,-1);
           }
       }
       else if (avpos>=0 && bvpos>=0 && cvpos>=0) {
           /* A and B and C are ambiguous vectors */
           pnga_error("a and b and c ambiguous", 1);
       }
   }
   if( (cihi - cilo +1) != m) pnga_error(" a & c dims error",m);
   if( (cjhi - cjlo +1) != n) pnga_error(" b & c dims error",n);
   if( (bihi - bilo +1) != k) pnga_error(" a & b dims error",k);
   
   chunk_cube = (k*(double)(m*n)) / (min_tasks * nproc);
   max_chunk = (Integer)pow(chunk_cube, (DoublePrecision)(1.0/3.0) );
   if (max_chunk < 32) max_chunk = 32;
   
#ifdef STATBUF
   if(atype ==  C_DBL || atype == C_FLOAT){
      Ichunk=D_CHUNK, Kchunk=D_CHUNK, Jchunk=D_CHUNK;
   }else{
      Ichunk=ICHUNK; Kchunk=KCHUNK; Jchunk=JCHUNK;
   }
#else
   {
     Integer elems, factor = sizeof(DoubleComplex)/GAsizeofM(atype);
     Ichunk = Jchunk = Kchunk = CHUNK_SIZE;
     
     if ( max_chunk > Ichunk) {       
       /*if memory if very limited, performance degrades for large matrices
	 as chunk size is very small, which leads to communication overhead)*/
       Integer avail = pnga_memory_avail_type(atype);
       pnga_gop(pnga_type_f2c(MT_F_INT), &avail, (Integer)1, "min");
       if(avail<MINMEM && pnga_nodeid()==0) pnga_error("Not enough memory",avail);
       elems = (Integer)(avail*0.9);/* Donot use every last drop */
       
       max_chunk=GA_MIN(max_chunk, (Integer)(sqrt( (double)((elems-EXTRA)/3))));
       Ichunk = GA_MIN(m,max_chunk);
       Jchunk = GA_MIN(n,max_chunk);
       Kchunk = GA_MIN(k,max_chunk);
     }
     else /* "EXTRA" elems for safety - just in case */
       elems = 3*Ichunk*Jchunk + EXTRA*factor;

     a = (DoubleComplex*) pnga_malloc(elems, atype, "GA mulmat bufs");     
     b = a + (Ichunk*Kchunk)/factor + 1; 
     c = b + (Kchunk*Jchunk)/factor + 1;
   }
#endif

   if(atype==C_DCPL){if((((DoubleComplex*)beta)->real == 0) &&
	       (((DoubleComplex*)beta)->imag ==0)) need_scaling =0;} 
   else if(atype==C_SCPL){if((((SingleComplex*)beta)->real == 0) &&
	       (((SingleComplex*)beta)->imag ==0)) need_scaling =0;} 
   else if(atype==C_DBL){if(*(DoublePrecision *)beta == 0)need_scaling =0;}
   else if( *(float*)beta ==0) need_scaling =0;

   if(need_scaling) pnga_scale_patch(g_c, clo, chi, beta);
   else      pnga_fill_patch(g_c, clo, chi, beta);
  
   for(jlo = 0; jlo < n; jlo += Jchunk){ /* loop through columns of g_c patch */
       jhi = GA_MIN(n-1, jlo+Jchunk-1);
       jdim= jhi - jlo +1;
       
       for(klo = 0; klo < k; klo += Kchunk){    /* loop cols of g_a patch */
	 khi = GA_MIN(k-1, klo+Kchunk-1);        /* loop rows of g_b patch */
	 kdim= khi - klo +1;               

	 get_new_B = TRUE;
	 
	 for(ilo = 0; ilo < m; ilo += Ichunk){ /*loop through rows of g_c patch */
	   
	   if(ijk%nproc == iproc){
	     ihi = GA_MIN(m-1, ilo+Ichunk-1);
	     idim= cdim = ihi - ilo +1;
	     
	     if(atype == C_FLOAT) 
	       for (i = 0; i < idim*jdim; i++) *(((float*)c)+i)=0;
	     else if(atype ==  C_DBL)
	       for (i = 0; i < idim*jdim; i++) *(((double*)c)+i)=0;
	     else if(atype == C_SCPL)
	       for (i = 0; i < idim*jdim; i++){
                 ((SingleComplex*)c)[i].real=0;
                 ((SingleComplex*)c)[i].imag=0;
               }
             else
	       for (i = 0; i < idim*jdim; i++){ c[i].real=0;c[i].imag=0;}
	     
	     if (*transa == 'n' || *transa == 'N'){ 
	       adim = idim;
	       i0= ailo+ilo; i1= ailo+ihi;   
	       j0= ajlo+klo; j1= ajlo+khi;
	     }else{
	       adim = kdim;
	       i0= ajlo+klo; i1= ajlo+khi;   
	       j0= ailo+ilo; j1= ailo+ihi;
	     }

	     /* ga_get_(g_a, &i0, &i1, &j0, &j1, a, &adim); */
	     memcpy(tmplo,alo,arank*sizeof(Integer));
	     memcpy(tmphi,ahi,arank*sizeof(Integer));
	     SETINT(tmpld,1,arank-1);
	     tmplo[aipos]=i0; tmphi[aipos]=i1;
	     tmplo[ajpos]=j0; tmphi[ajpos]=j1;
	     tmpld[aipos]=i1-i0+1;
	     tmpld[ajpos]=j1-j0+1;
	     pnga_get(g_a,tmplo,tmphi,a,tmpld);
	     
	     if(get_new_B) {
	       if (*transb == 'n' || *transb == 'N'){ 
		 bdim = kdim;
		 i0= bilo+klo; i1= bilo+khi;   
		 j0= bjlo+jlo; j1= bjlo+jhi;
	       }else{
		 bdim = jdim;
		 i0= bjlo+jlo; i1= bjlo+jhi;   
		 j0= bilo+klo; j1= bilo+khi;
	       }
	       /* ga_get_(g_b, &i0, &i1, &j0, &j1, b, &bdim); */
	       memcpy(tmplo,blo,brank*sizeof(Integer));
	       memcpy(tmphi,bhi,brank*sizeof(Integer));
	       SETINT(tmpld,1,brank-1);
	       tmplo[bipos]=i0; tmphi[bipos]=i1;
	       tmplo[bjpos]=j0; tmphi[bjpos]=j1;
	       tmpld[bipos]=i1-i0+1;
	       tmpld[bjpos]=j1-j0+1;
	       pnga_get(g_b,tmplo,tmphi,b,tmpld);
	       get_new_B = FALSE;
	     }

	     idim_t=idim; jdim_t=jdim; kdim_t=kdim;
	     adim_t=adim; bdim_t=bdim; cdim_t=cdim;

		  switch(atype) {
		  case C_FLOAT:
		    BLAS_SGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
			   (Real *)alpha, (Real *)a, &adim_t,
               (Real *)b, &bdim_t, (Real *)&ONE_CF,
               (Real *)c, &cdim_t);
		    break;
		  case C_DBL:
		    BLAS_DGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
			   (DoublePrecision *)alpha, (DoublePrecision *)a, &adim_t,
               (DoublePrecision *)b, &bdim_t, (DoublePrecision *)&ONE,
               (DoublePrecision *)c, &cdim_t);
		    break;
		  case C_DCPL:
		    BLAS_ZGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
			   (DoubleComplex *)alpha, (DoubleComplex *)a, &adim_t,
               (DoubleComplex *)b, &bdim_t, (DoubleComplex *)&ONE,
               (DoubleComplex *)c, &cdim_t);
		    break;
		  case C_SCPL:
		    BLAS_CGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
			   (SingleComplex *)alpha, (SingleComplex *)a, &adim_t,
               (SingleComplex *)b, &bdim_t, (SingleComplex *)&ONE_CF,
               (SingleComplex *)c, &cdim_t);
		    break;
		  default:
		    pnga_error("ga_matmul_patch: wrong data type", atype);
		  }

                  i0= cilo+ilo; i1= cilo+ihi;   j0= cjlo+jlo; j1= cjlo+jhi;
                  /* ga_acc_(g_c, &i0, &i1, &j0, &j1, (DoublePrecision*)c, 
                                            &cdim, (DoublePrecision*)&ONE); */
		  memcpy(tmplo,clo,crank*sizeof(Integer));
		  memcpy(tmphi,chi,crank*sizeof(Integer));
		  SETINT(tmpld,1,crank-1);
		  tmplo[cipos]=i0; tmphi[cipos]=i1;
		  tmplo[cjpos]=j0; tmphi[cjpos]=j1;
		  tmpld[cipos]=i1-i0+1;
		  tmpld[cjpos]=j1-j0+1;
		  if(atype == C_FLOAT || atype == C_SCPL) 
		    pnga_acc(g_c,tmplo,tmphi,(float *)c,tmpld, &ONE_CF);
		  else
		    pnga_acc(g_c,tmplo,tmphi,c,tmpld,(DoublePrecision*)&ONE);
               }
	   ++ijk;
	 }
       }
   }

#ifndef STATBUF
   pnga_free(a);
#endif
   
   if(local_sync_end)pnga_sync(); 
}